

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::BeginDataSegment
          (BinaryReaderIR *this,Index index,Index memory_index,bool passive)

{
  DataSegmentModuleField *pDVar1;
  Location local_a8;
  Var local_88;
  DataSegmentModuleField *local_40;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_38;
  
  GetLocation(&local_88.loc,this);
  MakeUnique<wabt::DataSegmentModuleField,wabt::Location>((wabt *)&local_40,&local_88.loc);
  pDVar1 = local_40;
  GetLocation(&local_a8,this);
  Var::Var(&local_88,memory_index,&local_a8);
  Var::operator=(&(pDVar1->data_segment).memory_var,&local_88);
  Var::~Var(&local_88);
  (pDVar1->data_segment).passive = passive;
  local_38._M_head_impl = local_40;
  local_40 = (DataSegmentModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                       *)&local_38);
  if (local_38._M_head_impl != (DataSegmentModuleField *)0x0) {
    (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_38._M_head_impl = (DataSegmentModuleField *)0x0;
  if (local_40 != (DataSegmentModuleField *)0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginDataSegment(Index index,
                                        Index memory_index,
                                        bool passive) {
  auto field = MakeUnique<DataSegmentModuleField>(GetLocation());
  DataSegment& data_segment = field->data_segment;
  data_segment.memory_var = Var(memory_index, GetLocation());
  data_segment.passive = passive;
  module_->AppendField(std::move(field));
  return Result::Ok;
}